

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall
KokkosTools::SpaceTimeStack::State::begin_deep_copy
          (State *this,Space dst_space,char *dst_name,void *param_3,Space src_space,char *src_name,
          void *param_6,uint64_t param_7)

{
  string frame_name;
  
  frame_name._M_dataplus._M_p = (pointer)&frame_name.field_2;
  frame_name._M_string_length = 0;
  frame_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  get_space_name(dst_space);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  get_space_name(src_space);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  begin_frame(this,frame_name._M_dataplus._M_p,STACK_COPY);
  std::__cxx11::string::~string((string *)&frame_name);
  return;
}

Assistant:

void begin_deep_copy(Space dst_space, const char* dst_name, const void*,
                       Space src_space, const char* src_name, const void*,
                       std::uint64_t) {
    std::string frame_name;
    frame_name += "\"";
    frame_name += dst_name;
    frame_name += "\"=\"";
    frame_name += src_name;
    frame_name += "\" (";
    frame_name += get_space_name(dst_space);
    frame_name += "->";
    frame_name += get_space_name(src_space);
    frame_name += ")";
    begin_frame(frame_name.c_str(), STACK_COPY);
  }